

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

_Bool parts_is_snan_frac(uint64_t frac,float_status *status)

{
  flag fVar1;
  uint64_t uVar2;
  flag msb;
  float_status *status_local;
  uint64_t frac_local;
  
  uVar2 = extract64(frac,0x3d,1);
  fVar1 = snan_bit_is_one(status);
  return (flag)uVar2 == fVar1;
}

Assistant:

static bool parts_is_snan_frac(uint64_t frac, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return false;
#else
    flag msb = extract64(frac, DECOMPOSED_BINARY_POINT - 1, 1);
    return msb == snan_bit_is_one(status);
#endif
}